

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_appendADynArray_success_nullptrSrcArray_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *expr;
  char **ppcVar3;
  char *pcVar4;
  char *pcVar5;
  char *local_38;
  char *local_30;
  char *local_28;
  undefined8 uStack_20;
  
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_20 = 0x116609;
  pcVar2 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(pcVar2,"0123",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_20 = 0x116635;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e3);
  uStack_20 = 0x116642;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e4);
  uStack_20 = 0x11664f;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e5);
  if (pcVar2 == (char *)0x0) {
    ppcVar3 = &local_28;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) destArray.buffer != NULL";
    pcVar5 = "(void*) destArray.buffer";
    iVar1 = 0x5e6;
  }
  else {
    uStack_20 = 0x116669;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5e6);
    uStack_20 = 0x11667b;
    iVar1 = strcmp("0123",pcVar2);
    if (iVar1 != 0) {
      uStack_20 = 0;
      local_28 = "\"";
      local_30 = "0123";
      local_38 = "\"";
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5e7,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "destArray.buffer == \"0123\"","destArray.buffer","\"",pcVar2,"\"",
                        "\"0123\"");
    }
    uStack_20 = 0x116697;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5e7);
    uStack_20 = 0x1166a4;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5e8);
    if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
      uStack_20 = 0x1166c5;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x5e9);
      private_ACUtilsTest_ADynArray_freeCount = private_ACUtilsTest_ADynArray_freeCount + 1;
      free(pcVar2);
      return;
    }
    ppcVar3 = &local_38;
    local_30 = "0";
    local_38 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
    pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount";
    iVar1 = 0x5e9;
  }
  uStack_20 = 0;
  local_28 = (char *)0x0;
  *(code **)((long)ppcVar3 + -8) = test_ADynArray_appendADynArray_success_zeroSizeSrcArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar1,expr,pcVar2,pcVar4,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_success_nullptrSrcArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray *srcArray = nullptr;
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "0123", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(&destArray, srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
}